

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFArgParser.hh
# Opt level: O2

void __thiscall
QPDFArgParser::HelpTopic::HelpTopic(HelpTopic *this,string *short_text,string *long_text)

{
  _Rb_tree_header *p_Var1;
  
  std::__cxx11::string::string((string *)this,(string *)short_text);
  std::__cxx11::string::string((string *)&this->long_text,(string *)long_text);
  p_Var1 = &(this->options)._M_t._M_impl.super__Rb_tree_header;
  (this->options)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->options)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->options)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->options)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->options)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  return;
}

Assistant:

HelpTopic(std::string const& short_text, std::string const& long_text) :
            short_text(short_text),
            long_text(long_text)
        {
        }